

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O1

bool __thiscall
MemTable::_put(MemTable *this,NodePosi pred_node,longlong key,string *value,bool delete_flag)

{
  list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_> *this_00;
  mt19937_64 *pmVar1;
  _List_node_base *p_Var2;
  result_type_conflict rVar3;
  time_t ts;
  NodePosi below_node;
  long lVar4;
  mt19937_64 *pred_node_00;
  _List_node_base *p_Var5;
  mt19937_64 *ctx;
  bool bVar6;
  QuadList<SSTableDataEntry> local_d0;
  SSTableDataEntry local_b0;
  SSTableDataEntry local_70;
  
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::seed == '\0') {
    _put();
  }
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::gen == '\0') {
    _put();
  }
  if (_put(QuadListNode<SSTableDataEntry>*,long_long,std::__cxx11::string,bool)::rand == '\0') {
    _put();
  }
  ts = time((time_t *)0x0);
  p_Var5 = (this->qlist).
           super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  SSTableDataEntry::SSTableDataEntry(&local_70,delete_flag,ts,key,value);
  below_node = QuadList<SSTableDataEntry>::insertAfterAbove
                         ((QuadList<SSTableDataEntry> *)(p_Var5 + 1),&local_70,pred_node,
                          (NodePosi)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
    operator_delete(local_70.value._M_dataplus._M_p,local_70.value.field_2._M_allocated_capacity + 1
                   );
  }
  if (below_node == (NodePosi)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (below_node->data).value._M_string_length + 0x19;
  }
  this->_size_bytes = this->_size_bytes + lVar4;
  ctx = &_put::gen;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (&_put::rand,&_put::gen,&_put::rand._M_param);
  if (rVar3 != 0) {
    this_00 = &this->qlist;
    p_Var5 = (_List_node_base *)this_00;
    do {
      pred_node_00 = *(mt19937_64 **)
                      ((long)((SSTableDataEntry *)((mt19937_64 *)pred_node)->_M_x + 1) + 0x10);
      bVar6 = pred_node_00 == (mt19937_64 *)0x0;
      if (bVar6) {
        if ((mt19937_64 *)pred_node != (mt19937_64 *)0x0) {
          ctx = (mt19937_64 *)p_Var5->_M_prev;
          pmVar1 = (mt19937_64 *)((SSTableDataEntry *)ctx->_M_x)->value_length;
          if (pmVar1 != (mt19937_64 *)pred_node) {
            ctx = (mt19937_64 *)(((SSTableDataEntry *)ctx->_M_x)->value)._M_dataplus._M_p;
            while (ctx != (mt19937_64 *)pred_node) {
              pred_node = *(NodePosi *)((SSTableDataEntry *)((mt19937_64 *)pred_node)->_M_x + 1);
              pred_node_00 = *(mt19937_64 **)
                              ((long)((SSTableDataEntry *)((mt19937_64 *)pred_node)->_M_x + 1) +
                              0x10);
              bVar6 = pred_node_00 == (mt19937_64 *)0x0;
              if (!bVar6) goto LAB_001059d3;
              if (((mt19937_64 *)pred_node == (mt19937_64 *)0x0) ||
                 (pmVar1 == (mt19937_64 *)pred_node)) break;
            }
          }
        }
        if (!bVar6) goto LAB_001059d3;
        if (p_Var5->_M_prev ==
            (this_00->
            super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
            )._M_impl._M_node.super__List_node_base._M_next) {
          local_d0._vptr_QuadList = (_func_int **)&PTR__QuadList_00110ce0;
          local_d0._size = 0;
          QuadList<SSTableDataEntry>::init(&local_d0,(EVP_PKEY_CTX *)ctx);
          std::__cxx11::list<QuadList<SSTableDataEntry>,std::allocator<QuadList<SSTableDataEntry>>>
          ::_M_insert<QuadList<SSTableDataEntry>>
                    ((list<QuadList<SSTableDataEntry>,std::allocator<QuadList<SSTableDataEntry>>> *)
                     this_00,(this_00->
                             super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                             )._M_impl._M_node.super__List_node_base._M_next,&local_d0);
          QuadList<SSTableDataEntry>::~QuadList(&local_d0);
        }
        p_Var5 = p_Var5->_M_prev;
        pred_node_00 = (mt19937_64 *)p_Var5->_M_prev[1]._M_prev;
      }
      else {
LAB_001059d3:
        p_Var5 = p_Var5->_M_prev;
      }
      p_Var2 = p_Var5->_M_prev;
      SSTableDataEntry::SSTableDataEntry(&local_b0,delete_flag,0,key,"");
      below_node = QuadList<SSTableDataEntry>::insertAfterAbove
                             ((QuadList<SSTableDataEntry> *)(p_Var2 + 1),&local_b0,
                              (NodePosi)pred_node_00,below_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.value._M_dataplus._M_p != &local_b0.value.field_2) {
        operator_delete(local_b0.value._M_dataplus._M_p,
                        local_b0.value.field_2._M_allocated_capacity + 1);
      }
      ctx = &_put::gen;
      rVar3 = std::uniform_int_distribution<int>::operator()
                        (&_put::rand,&_put::gen,&_put::rand._M_param);
      pred_node = (NodePosi)pred_node_00;
    } while (rVar3 != 0);
  }
  this->_size = this->_size + 1;
  return true;
}

Assistant:

bool MemTable::_put(NodePosi pred_node, long long key, std::string value, bool delete_flag) {
    auto curr_level = qlist.rbegin(); // If skipSearch didn't find k, it must return a appropriate position
    // at the bottom of qlist for insert a new tower of k
    static auto seed = time(nullptr);
    static auto gen = std::mt19937_64{static_cast<unsigned long long> (seed)};
    static auto rand = std::uniform_int_distribution<>{0, 1};
    auto timestamp = time(nullptr);
    auto new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, timestamp, key, std::move(value)},
                                                 pred_node);
    _size_bytes += size_of_node(new_node);
    while (rand(gen)) {
        while (!pred_node->above && curr_level->valid(pred_node))
            pred_node = pred_node->pred;
        if (pred_node->above) {
            // Find a node of a tower.
            pred_node = pred_node->above;
            curr_level++;
        } else {
            // Unable to find a tower higher than curr_level.
            if (--(curr_level.base()) == qlist.begin()) {
                // If the tower should grow though top of SkipList arrived, add a level as top
                qlist.push_front(MemTableLevel{});
            }
            curr_level++;
            pred_node = curr_level->first();
        }
        // Do not repeat data on upper node to save memory, because skipSearch always turn to bottom if hit.
        new_node = curr_level->insertAfterAbove(MemTableEntry{delete_flag, 0, key, ""}, pred_node, new_node);
    }
    _size++;
    return true;
}